

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this)

{
  cmMakefileLibraryTargetGenerator *this_local;
  
  ~cmMakefileLibraryTargetGenerator(this);
  operator_delete(this,0x458);
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator() =
  default;